

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O3

bool __thiscall
dap::json::JsonCppSerializer::object
          (JsonCppSerializer *this,function<bool_(dap::FieldSerializer_*)> *cb)

{
  bool bVar1;
  FS fs;
  Value *local_48;
  undefined1 local_40 [40];
  
  Json::Value::Value((Value *)local_40,objectValue);
  Json::Value::operator=(this->json,(Value *)local_40);
  Json::Value::~Value((Value *)local_40);
  local_40._8_8_ = this->json;
  local_40._0_8_ = &PTR__FieldSerializer_00aa57d8;
  local_48 = (Value *)local_40;
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    bVar1 = (*cb->_M_invoker)((_Any_data *)cb,(FieldSerializer **)&local_48);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool JsonCppSerializer::object(
    const std::function<bool(dap::FieldSerializer*)>& cb) {
  struct FS : public FieldSerializer {
    Json::Value* const json;

    FS(Json::Value* json) : json(json) {}
    bool field(const std::string& name, const SerializeFunc& cb) override {
      JsonCppSerializer s(&(*json)[name]);
      auto res = cb(&s);
      if (s.removed) {
        json->removeMember(name);
      }
      return res;
    }
  };

  *json = Json::Value(Json::objectValue);
  FS fs{json};
  return cb(&fs);
}